

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O1

uint64_t __thiscall BuildLog::LogEntry::HashCommand(LogEntry *this,StringPiece command)

{
  uint64_t uVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  
  pcVar3 = command.str_;
  uVar2 = (long)pcVar3 * -0x395b586ca42e166b ^ 0xdecafbaddecafbad;
  for (; (char *)0x7 < pcVar3; pcVar3 = pcVar3 + -8) {
    uVar4 = (long)(this->output)._M_dataplus._M_p * -0x395b586ca42e166b;
    uVar2 = ((uVar4 >> 0x2f ^ uVar4) * -0x395b586ca42e166b ^ uVar2) * -0x395b586ca42e166b;
    this = (LogEntry *)&(this->output)._M_string_length;
  }
  uVar1 = (*(code *)(&DAT_00126080 + *(int *)(&DAT_00126080 + (long)pcVar3 * 4)))
                    (this,&DAT_00126080 + *(int *)(&DAT_00126080 + (long)pcVar3 * 4),&DAT_00126080,
                     uVar2);
  return uVar1;
}

Assistant:

uint64_t BuildLog::LogEntry::HashCommand(StringPiece command) {
  return MurmurHash64A(command.str_, command.len_);
}